

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.hpp
# Opt level: O0

void __thiscall Tree::destroyRecursive(Tree *this,Vertex **root)

{
  Vertex *this_00;
  Vertex **root_local;
  Tree *this_local;
  
  if (*root != (Vertex *)0x0) {
    destroyRecursive(this,&(*root)->ptrLeft);
    destroyRecursive(this,&(*root)->ptrRight);
    this_00 = *root;
    if (this_00 != (Vertex *)0x0) {
      Vertex::~Vertex(this_00);
      operator_delete(this_00,0x30);
    }
  }
  return;
}

Assistant:

void destroyRecursive(Vertex **root) {
        if (*root) {
            destroyRecursive(&((*root)->ptrLeft));
            destroyRecursive(&((*root)->ptrRight));
            delete *root;
        }
    }